

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::TZDBNameSearchHandler::handleMatch
          (TZDBNameSearchHandler *this,int32_t matchLength,CharacterNode *node,UErrorCode *status)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  undefined8 *puVar6;
  MatchInfoCollection *this_00;
  ulong uVar7;
  undefined8 *puVar8;
  undefined4 in_register_00000034;
  char *__s2;
  char *pcVar9;
  UTimeZoneNameType nameType;
  ulong uVar10;
  int index;
  UBool UVar11;
  undefined8 *local_a8;
  undefined8 *local_88;
  UnicodeString local_70;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar11 = '\x01';
    if (node->fValues != (void *)0x0) {
      if (node->fHasValuesVector == '\0') {
        uVar3 = 1;
      }
      else {
        uVar3 = *(uint *)((long)node->fValues + 8);
      }
      pcVar5 = (char *)(ulong)uVar3;
      if ((int)uVar3 < 1) {
        pcVar5 = (char *)0x0;
      }
      local_88 = (undefined8 *)0x0;
      local_a8 = (undefined8 *)0x0;
      pcVar9 = (char *)CONCAT44(in_register_00000034,matchLength);
      __s2 = (char *)0x0;
      while (index = (int)__s2, index != (int)pcVar5) {
        puVar6 = (undefined8 *)CharacterNode::getValue(node,index);
        puVar8 = local_a8;
        if ((puVar6 != (undefined8 *)0x0) && ((*(uint *)(puVar6 + 1) & this->fTypes) != 0)) {
          lVar1 = puVar6[2];
          if (lVar1 == 0) {
            if (local_88 == (undefined8 *)0x0) {
              puVar8 = puVar6;
              local_88 = puVar6;
            }
          }
          else {
            uVar3 = *(uint *)(puVar6 + 3);
            pcVar9 = this->fRegion;
            uVar10 = 0;
            if (0 < (int)uVar3) {
              uVar10 = (ulong)uVar3;
            }
            uVar2 = 0;
            do {
              uVar7 = uVar2;
              puVar8 = local_a8;
              if (uVar10 == uVar7) break;
              __s2 = *(char **)(lVar1 + uVar7 * 8);
              iVar4 = strcmp(pcVar9,__s2);
              uVar2 = uVar7 + 1;
              puVar8 = puVar6;
            } while (iVar4 != 0);
            if (puVar8 != (undefined8 *)0x0) {
              puVar6 = puVar8;
            }
            local_a8 = puVar8;
            pcVar9 = __s2;
            puVar8 = puVar6;
            if ((long)uVar7 < (long)(int)uVar3) break;
          }
        }
        local_a8 = puVar8;
        pcVar9 = __s2;
        __s2 = (char *)(ulong)(index + 1);
      }
      UVar11 = '\x01';
      if (local_a8 != (undefined8 *)0x0) {
        nameType = *(UTimeZoneNameType *)(local_a8 + 1);
        if ((*(char *)((long)local_a8 + 0xc) != '\0') &&
           (((nameType == UTZNM_SHORT_DAYLIGHT || (nameType == UTZNM_SHORT_STANDARD)) &&
            ((~this->fTypes & 0x30) == 0)))) {
          nameType = UTZNM_SHORT_GENERIC;
        }
        this_00 = this->fResults;
        if (this_00 == (MatchInfoCollection *)0x0) {
          this_00 = (MatchInfoCollection *)UMemory::operator_new((UMemory *)0x10,(size_t)pcVar9);
          if (this_00 == (MatchInfoCollection *)0x0) {
            this->fResults = (MatchInfoCollection *)0x0;
            *status = U_MEMORY_ALLOCATION_ERROR;
            return '\x01';
          }
          TimeZoneNames::MatchInfoCollection::MatchInfoCollection(this_00);
          this->fResults = this_00;
        }
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          UnicodeString::UnicodeString(&local_70,(UChar *)*local_a8,-1);
          TimeZoneNames::MatchInfoCollection::addMetaZone
                    (this_00,nameType,matchLength,&local_70,status);
          UnicodeString::~UnicodeString(&local_70);
          if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (this->fMaxMatchLen < matchLength)) {
            this->fMaxMatchLen = matchLength;
          }
        }
      }
    }
  }
  else {
    UVar11 = '\0';
  }
  return UVar11;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }